

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O2

void __thiscall kratos::VarFanOutVisitor::visit(VarFanOutVisitor *this,Generator *generator)

{
  pointer *this_00;
  element_type *peVar1;
  uint64_t i;
  ulong uVar2;
  undefined1 auVar3 [8];
  long lVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_01;
  shared_ptr<kratos::AssignStmt> *stmt_00;
  undefined1 local_e0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  var_names;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c0;
  pointer local_b8;
  pointer local_b0;
  undefined1 auStack_a8 [8];
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  debug_info;
  undefined1 local_88 [8];
  shared_ptr<kratos::AssignStmt> stmt;
  vector<std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>_>_>
  chain;
  int local_54;
  undefined1 local_50 [8];
  shared_ptr<kratos::Var> dst;
  shared_ptr<kratos::Var> var;
  
  Generator::get_all_var_names_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_e0,generator);
  local_b8 = var_names.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  for (auVar3 = local_e0;
      this_01 = &dst.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
      auVar3 != (undefined1  [8])local_b8; auVar3 = (undefined1  [8])((long)auVar3 + 0x20)) {
    Generator::get_var((Generator *)this_01,(string *)generator);
    stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    compute_assign_chain
              ((shared_ptr<kratos::Var> *)this_01,
               (vector<std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>_>_>
                *)&stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount);
    if (0x40 < (ulong)-(long)stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi) {
      debug_info.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      auStack_a8 = (undefined1  [8])0x0;
      debug_info.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      lVar4 = 0x10;
      local_b0 = (pointer)auVar3;
      for (uVar2 = 0;
          uVar2 < (-(long)stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi >> 5) - 1U; uVar2 = uVar2 + 1) {
        stmt_00 = (shared_ptr<kratos::AssignStmt> *)
                  ((long)&(stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar4);
        std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)local_50,
                   (__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi[1]._vptr__Sp_counted_base + lVar4));
        if (generator->debug == true) {
          peVar1 = (stmt_00->super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
          std::
          vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
          ::
          insert<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,unsigned_int>*,std::vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>>,void>
                    ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                      *)auStack_a8,
                     (const_iterator)
                     debug_info.
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (peVar1->super_Stmt).super_IRNode.fn_name_ln.
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     *(pointer *)
                      ((long)&(peVar1->super_Stmt).super_IRNode.fn_name_ln.
                              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                              ._M_impl + 8));
        }
        Var::unassign((Var *)local_50,stmt_00);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&dst);
        lVar4 = lVar4 + 0x20;
      }
      std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)local_50,
                 (__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)0xffffffffffffffe0);
      Var::move_src_to((Var *)dst.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi,(Var *)local_50,generator,false);
      auVar3 = (undefined1  [8])local_b0;
      if ((dst.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[0x16].
           _M_use_count == 4) && (*(VarType *)((long)local_50 + 0x168) == PortIO)) {
        Var::assign((Var *)local_88,(shared_ptr<kratos::Var> *)local_50,(int)&dst + 8);
        if (generator->debug == true) {
          std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          ::operator=(&(((Stmt *)local_88)->super_IRNode).fn_name_ln,
                      (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                       *)auStack_a8);
          local_54 = 0xee;
          std::
          vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
          ::emplace_back<char_const(&)[81],int>
                    ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                      *)&(((Stmt *)local_88)->super_IRNode).fn_name_ln,
                     (char (*) [81])
                     "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/optimize.cc"
                     ,&local_54);
        }
        this_00 = &var_names.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<kratos::AssignStmt,void>
                  ((__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2> *)this_00,
                   (__shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2> *)local_88);
        Generator::add_stmt(generator,(shared_ptr<kratos::Stmt> *)this_00);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stmt);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&dst);
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 *)auStack_a8);
    }
    std::
    vector<std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>_>_>
    ::~vector((vector<std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>_>_>
               *)&stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&var);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_e0);
  return;
}

Assistant:

void visit(Generator* generator) override {
        auto var_names = generator->get_all_var_names();
        for (auto const& var_name : var_names) {
            auto var = generator->get_var(var_name);
            std::vector<std::pair<std::shared_ptr<Var>, std::shared_ptr<AssignStmt>>> chain;
            compute_assign_chain(var, chain);
            if (chain.size() <= 2) continue;  // nothing to be done

            std::vector<std::pair<std::string, uint32_t>> debug_info;

            for (uint64_t i = 0; i < chain.size() - 1; i++) {
                auto& [pre, stmt] = chain[i];
                auto next = chain[i + 1].first;

                // insert debug info
                if (generator->debug) {
                    debug_info.insert(debug_info.end(), stmt->fn_name_ln.begin(),
                                      stmt->fn_name_ln.end());
                }

                next->unassign(stmt);
            }

            auto dst = chain.back().first;
            Var::move_src_to(var.get(), dst.get(), generator, false);
            // if both of them are ports, we need to add a statement
            if (var->type() == VarType::PortIO && dst->type() == VarType::PortIO) {
                // need to add a top assign statement
                auto stmt = dst->assign(var, AssignmentType::Blocking);
                if (generator->debug) {
                    // copy every vars definition over
                    stmt->fn_name_ln = debug_info;
                    stmt->fn_name_ln.emplace_back(__FILE__, __LINE__);
                }
                generator->add_stmt(stmt);
            }
        }
    }